

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGhsMultiGenerator.cxx
# Opt level: O3

void __thiscall
cmGlobalGhsMultiGenerator::ComputeTargetObjectDirectory
          (cmGlobalGhsMultiGenerator *this,cmGeneratorTarget *gt)

{
  string *psVar1;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  string dir;
  string local_128;
  long *local_108;
  undefined8 local_100;
  long local_f8 [2];
  undefined8 local_e8;
  undefined8 local_e0;
  undefined1 *local_d8;
  undefined1 local_d0 [32];
  undefined8 local_b0;
  undefined8 local_a8;
  undefined1 *local_a0;
  undefined1 local_98 [32];
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_78;
  undefined8 local_60;
  undefined1 *local_58;
  undefined8 local_50;
  undefined8 local_48;
  long *local_40;
  long **local_38;
  undefined8 local_30;
  undefined1 *local_28;
  undefined8 local_20;
  
  psVar1 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_(gt->LocalGenerator);
  (*(gt->LocalGenerator->super_cmOutputConverter)._vptr_cmOutputConverter[0x10])
            (&local_108,gt->LocalGenerator,gt);
  local_78.first._M_str = (psVar1->_M_dataplus)._M_p;
  local_78.first._M_len = psVar1->_M_string_length;
  local_78.second = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_a0 = local_98;
  local_b0 = 0;
  local_a8 = 1;
  local_98[0] = 0x2f;
  local_60 = 1;
  local_50 = 0;
  local_48 = local_100;
  local_40 = local_108;
  local_d8 = local_d0;
  local_e8 = 0;
  local_e0 = 1;
  local_d0[0] = 0x2f;
  local_30 = 1;
  local_20 = 0;
  views._M_len = 4;
  views._M_array = &local_78;
  local_58 = local_a0;
  local_38 = &local_108;
  local_28 = local_d8;
  cmCatViews(&local_128,views);
  if (local_108 != local_f8) {
    operator_delete(local_108,local_f8[0] + 1);
  }
  std::__cxx11::string::_M_assign((string *)&gt->ObjectDirectory);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != &local_128.field_2) {
    operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmGlobalGhsMultiGenerator::ComputeTargetObjectDirectory(
  cmGeneratorTarget* gt) const
{
  // Compute full path to object file directory for this target.
  std::string dir =
    cmStrCat(gt->LocalGenerator->GetCurrentBinaryDirectory(), '/',
             gt->LocalGenerator->GetTargetDirectory(gt), '/');
  gt->ObjectDirectory = dir;
}